

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

void ON_SubDEdgePtrLink::Resolve3OrMoreEdges
               (uint unset_nbr1_index,uint count,ON_SubDVertex *v,ON_SubDEdgePtrLink *links)

{
  char cVar1;
  ON_SubDEdge *pOVar2;
  ON_SubDVertexTag OVar3;
  ulong uVar4;
  ON_2udex OVar5;
  uint uVar6;
  ON_SubDEdge **ppOVar7;
  long lVar8;
  uint uVar9;
  ON_SubDEdge **ppOVar10;
  uint j;
  ulong uVar11;
  long lVar12;
  ON_SubDEdgePtrLink *pOVar13;
  ON_2udex OVar14;
  bool bVar15;
  uint local_d8 [4];
  ulong local_c8 [2];
  ulong local_b8 [2];
  ON_2udex local_a8 [5];
  ON_2udex pairs [2];
  uint crease_edge_link_index [4];
  uint smooth_edge_link_index [4];
  ON_SubDEdge *vertex_edges [4];
  ON_SubDEdge *link_edges [4];
  
  if ((v == (ON_SubDVertex *)0x0 || count < 3) || (v->m_edge_count != count)) {
    return;
  }
  OVar3 = v->m_vertex_tag;
  if (count == 4) {
    if (1 < (byte)(OVar3 - Smooth)) {
      return;
    }
  }
  else if (count == 3) {
    if ((OVar3 != Crease) && (OVar3 != Dart)) {
      return;
    }
  }
  else {
    bVar15 = OVar3 != Crease;
    OVar3 = Crease;
    if (bVar15) {
      return;
    }
  }
  pairs[1].i = 0;
  pairs[1].j = 0;
  crease_edge_link_index[0] = 0;
  crease_edge_link_index[1] = 0;
  local_a8[4].i = 0;
  local_a8[4].j = 0;
  pairs[0].i = 0;
  pairs[0].j = 0;
  local_a8[2].i = 0;
  local_a8[2].j = 0;
  local_a8[3].i = 0;
  local_a8[3].j = 0;
  local_a8[0].i = 0;
  local_a8[0].j = 0;
  local_a8[1].i = 0;
  local_a8[1].j = 0;
  local_b8[0] = 0;
  local_c8[0] = 0;
  uVar11 = 0;
  uVar6 = 0;
  uVar9 = 0;
  pOVar13 = links;
  do {
    OVar5 = (ON_2udex)((pOVar13->m_ep).m_ptr & 0xfffffffffffffff8);
    if (OVar5 == (ON_2udex)0x0) {
      return;
    }
    OVar14 = (ON_2udex)(v->m_edges[uVar11].m_ptr & 0xfffffffffffffff8);
    if (OVar14 == (ON_2udex)0x0) {
      return;
    }
    if (uVar11 < 4) {
      pairs[uVar11 - 1] = OVar5;
      local_a8[uVar11] = OVar14;
    }
    cVar1 = *(char *)((long)OVar5 + 0x60);
    if (cVar1 == '\x04') {
LAB_005ed9d1:
      if (*(short *)((long)OVar5 + 100) != 2) {
        if (cVar1 != '\x02') {
          return;
        }
        goto LAB_005ed9f5;
      }
      if (uVar9 < 4) {
        *(int *)((long)local_b8 + (ulong)uVar9 * 4) = (int)uVar11;
      }
      uVar9 = uVar9 + 1;
    }
    else {
      if (cVar1 != '\x02') {
        if (cVar1 != '\x01') {
          return;
        }
        goto LAB_005ed9d1;
      }
LAB_005ed9f5:
      if (uVar6 < 4) {
        *(int *)((long)local_c8 + (ulong)uVar6 * 4) = (int)uVar11;
      }
      uVar6 = uVar6 + 1;
    }
    uVar11 = uVar11 + 1;
    pOVar13 = pOVar13 + 1;
  } while (count != uVar11);
  if (OVar3 == Crease && uVar6 == 2) {
    links[local_c8[0] & 0xffffffff].m_nbr_index = links[local_c8[0] >> 0x20].m_index;
    links[local_c8[0] >> 0x20].m_nbr_index = links[local_c8[0] & 0xffffffff].m_index;
    if (uVar9 != 2) goto joined_r0x005eda97;
  }
  else if (uVar9 != 2) {
    if ((uVar9 != 4 || count != 4) || uVar6 != 0) {
      return;
    }
    if (OVar3 != Smooth || v->m_face_count != 4) {
      return;
    }
    uVar9 = 0;
    uVar11 = 0;
    do {
      lVar8 = 0;
      do {
        if (local_a8[lVar8] == pairs[uVar11 - 1]) {
          local_a8[lVar8].i = 0;
          local_a8[lVar8].j = 0;
          uVar9 = uVar9 + 1;
          break;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
    } while ((uVar11 + 1 == (ulong)uVar9) && (bVar15 = uVar11 < 3, uVar11 = uVar11 + 1, bVar15));
    if (uVar9 != 4) {
      return;
    }
    lVar8 = 0;
    do {
      lVar12 = *(long *)((long)&pairs[-1].i + lVar8);
      uVar11 = *(ulong *)(lVar12 + 0x68);
      *(ulong *)((long)crease_edge_link_index + lVar8 * 2 + 8) = uVar11 & 0xfffffffffffffff8;
      uVar4 = *(ulong *)(lVar12 + 0x70) & 0xfffffffffffffff8;
      *(ulong *)((long)smooth_edge_link_index + lVar8 * 2) = uVar4;
      if ((uVar11 & 0xfffffffffffffff8) == 0) {
        return;
      }
      if (uVar4 == 0) {
        return;
      }
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x20);
    uVar11 = 0;
    lVar8 = -3;
    ppOVar7 = vertex_edges;
    uVar9 = 0;
    do {
      if (uVar11 < 3) {
        pOVar2 = *(ON_SubDEdge **)(crease_edge_link_index + uVar11 * 4 + 2);
        uVar4 = (ulong)uVar9;
        ppOVar10 = ppOVar7;
        lVar12 = lVar8;
        do {
          if (((pOVar2 != ppOVar10[-1]) && (pOVar2 != *ppOVar10)) &&
             (*(ON_SubDEdge **)(smooth_edge_link_index + uVar11 * 4) != *ppOVar10 &&
              *(ON_SubDEdge **)(smooth_edge_link_index + uVar11 * 4) != ppOVar10[-1])) {
            uVar9 = (uint)uVar4;
            if (uVar9 < 2) {
              local_d8[uVar4 * 2] = (uint)uVar11;
              local_d8[uVar4 * 2 + 1] = (int)lVar12 + 4;
              uVar4 = (ulong)(uVar9 + 1);
            }
            else {
              uVar9 = uVar9 + 1;
              uVar4 = 0;
              if (2 < uVar9) break;
            }
          }
          ppOVar10 = ppOVar10 + 2;
          uVar9 = (uint)uVar4;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0);
      }
      uVar11 = uVar11 + 1;
      lVar8 = lVar8 + 1;
      ppOVar7 = ppOVar7 + 2;
      if (uVar11 == 4) {
        if (uVar9 != 2) {
          return;
        }
        links[local_d8[0]].m_nbr_index = links[local_d8[1]].m_index;
        links[local_d8[1]].m_nbr_index = links[local_d8[0]].m_index;
        links[local_d8[2]].m_nbr_index = links[local_d8[3]].m_index;
        links[local_d8[3]].m_nbr_index = links[local_d8[2]].m_index;
        return;
      }
    } while( true );
  }
  links[local_b8[0] & 0xffffffff].m_nbr_index = links[local_b8[0] >> 0x20].m_index;
  links[local_b8[0] >> 0x20].m_nbr_index = links[local_b8[0] & 0xffffffff].m_index;
  local_b8[0]._0_4_ = (uint)local_c8[0];
  uVar9 = uVar6;
joined_r0x005eda97:
  if (uVar9 == 1) {
    links[(uint)local_b8[0]].m_nbr_index = unset_nbr1_index;
  }
  return;
}

Assistant:

void ON_SubDEdgePtrLink::Resolve3OrMoreEdges(
  const unsigned int unset_nbr1_index,
  unsigned int count,
  const ON_SubDVertex* v,
  ON_SubDEdgePtrLink* links
)
{
  // If the case can't be resolved by Resolve3OrMoreEdges(), 
  // then the vertex will not appear in the middle of a chain.

  if (count < 3 || nullptr == v || count != (unsigned int)v->m_edge_count)
    return;

  switch (count)
  {
  case 3:
    if (false == v->IsCrease() && false == v->IsDart())
      return;
    break;

  case 4:
    if (false == v->IsCrease() && false == v->IsSmooth())
      return;
    break;

  default:
    if (false == v->IsCrease())
      return;
    break;
  }

  const ON_SubDEdge* link_edges[4] = {};
  const ON_SubDEdge* vertex_edges[4] = {};
  unsigned int crease_edge_count = 0;
  unsigned int smooth_edge_count = 0;
  unsigned int smooth_edge_link_index[4] = {};
  unsigned int crease_edge_link_index[4] = {};
  for (unsigned int j = 0; j < count; j++)
  {
    const ON_SubDEdge* e = links[j].m_ep.Edge();
    if (nullptr == e)
      return;
    const ON_SubDEdge* ve = v->Edge(j);
    if (nullptr == ve)
      return;
    if (j < 4)
    {
      link_edges[j] = e;
      vertex_edges[j] = ve;
    }

    if (e->IsSmooth() && 2 == e->m_face_count)
    {
      if ( smooth_edge_count < 4)
        smooth_edge_link_index[smooth_edge_count] = j;
      ++smooth_edge_count;
    }
    else if (e->IsCrease())
    {
      if (crease_edge_count < 4)
        crease_edge_link_index[crease_edge_count] = j;
      ++crease_edge_count;
    }
    else
      return;
  }

  if ( 2 == crease_edge_count && v->IsCrease() )
  {
    // Link the two creased edges.
    // The vertex will be interior in a chain and the edges
    // will be next to each other.
    links[crease_edge_link_index[0]].m_nbr_index = links[crease_edge_link_index[1]].m_index;
    links[crease_edge_link_index[1]].m_nbr_index = links[crease_edge_link_index[0]].m_index;
    if (1 == smooth_edge_count)
    {
      // this edge will be at the end of a chain.
      links[smooth_edge_link_index[0]].m_nbr_index = unset_nbr1_index;
    }
  }

  if (2 == smooth_edge_count)
  {
    // Link the two smooth edges.
    // The vertex will be interior in a chain and the edges
    // will be next to each other.
    links[smooth_edge_link_index[0]].m_nbr_index = links[smooth_edge_link_index[1]].m_index;
    links[smooth_edge_link_index[1]].m_nbr_index = links[smooth_edge_link_index[0]].m_index;
    if (1 == crease_edge_count)
    {
      // this edge will be at the end of a chain
      links[crease_edge_link_index[0]].m_nbr_index = unset_nbr1_index;
    }
   }

  if (
    4 != count
    || 4 != smooth_edge_count
    || 0 != crease_edge_count
    || 4 != v->m_face_count
    || 4 != v->m_edge_count
    || false == v->IsSmooth()
    )
    return;

  // make sure vertex_edges[] and link_edges[] are the same list.
  unsigned int match_count = 0;
  for (unsigned int j = 0; j == match_count && j < count; j++)
  {
    for (unsigned int k = 0; k < count; k++)
    {
      if (vertex_edges[k] == link_edges[j])
      {
        vertex_edges[k] = nullptr;
        match_count++;
        break;
      }
    }
  }
  if (match_count != count)
    return;
  
  // vertex has 4 faces and 4 smooth edges. Link opposite edges.
  const ON_SubDFace* edge_faces[4][2];
  for (unsigned int j = 0; j < 4; j++)
  {
    edge_faces[j][0] = link_edges[j]->Face(0);
    edge_faces[j][1] = link_edges[j]->Face(1);
    if (nullptr == edge_faces[j][0] || nullptr == edge_faces[j][1])
      return;
  }
  ON_2udex pairs[2];
  unsigned int pair_count = 0;
  ON_2udex pair;
  for (pair.i = 0; pair.i < 4; ++pair.i) for (pair.j = pair.i+1; pair.j < 4; ++pair.j)
  {
    if (
      edge_faces[pair.i][0] != edge_faces[pair.j][0]
      && edge_faces[pair.i][0] != edge_faces[pair.j][1]
      && edge_faces[pair.i][1] != edge_faces[pair.j][0]
      && edge_faces[pair.i][1] != edge_faces[pair.j][1]
      )
    {
      // the associated edges share no faces.
      if ( pair_count < 2)
        pairs[pair_count] = pair;
      if (++pair_count > 2)
        break;
    }
  }
  if (2 == pair_count)
  {
    links[pairs[0].i].m_nbr_index = links[pairs[0].j].m_index;
    links[pairs[0].j].m_nbr_index = links[pairs[0].i].m_index;
    links[pairs[1].i].m_nbr_index = links[pairs[1].j].m_index;
    links[pairs[1].j].m_nbr_index = links[pairs[1].i].m_index;
  }

  return;
}